

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementFormControlTextArea.cpp
# Opt level: O2

bool __thiscall Rml::ElementFormControlTextArea::GetWordWrap(ElementFormControlTextArea *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  String attribute;
  allocator<char> local_6a;
  allocator<char> local_69;
  String local_68;
  Dictionary local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"wrap",&local_69);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_6a);
  Get<std::__cxx11::string>
            (&local_28,(Rml *)&(this->super_ElementFormControl).super_Element.attributes,&local_48,
             &local_68,in_R8);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::~string((string *)&local_48);
  bVar1 = ::std::operator!=(&local_28,"nowrap");
  ::std::__cxx11::string::~string((string *)&local_28);
  return bVar1;
}

Assistant:

bool ElementFormControlTextArea::GetWordWrap()
{
	String attribute = GetAttribute<String>("wrap", "");
	return attribute != "nowrap";
}